

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  test_simple_factory();
  test_factory();
  test_abstract_factory();
  test_builder();
  test_prototype();
  test_singleton();
  test_adapter();
  test_decorator();
  test_bridge();
  test_compose();
  test_facade();
  test_flyweight();
  test_proxy();
  test_chain_of_responsibility();
  test_command();
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    test_simple_factory();
    test_factory();
    test_abstract_factory();
    test_builder();
    test_prototype();
    test_singleton();
    test_adapter();
    test_decorator();
    test_bridge();
    test_compose();
    test_facade();
    test_flyweight();
    test_proxy();
    test_chain_of_responsibility();
    test_command();

    return 0;
}